

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void ConvertBGRAToRGBA_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined4 uVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 *puVar55;
  __m128i *out;
  int iVar56;
  __m128i *in;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  iVar56 = num_pixels;
  if (7 < num_pixels) {
    do {
      auVar57 = *(undefined1 (*) [16])src;
      auVar58 = *(undefined1 (*) [16])((long)src + 0x10);
      src = (uint32_t *)((long)src + 0x20);
      auVar59[1] = 0;
      auVar59[0] = auVar57[8];
      auVar59[2] = auVar57[9];
      auVar59[3] = 0;
      auVar59[4] = auVar57[10];
      auVar59[5] = 0;
      auVar59[6] = auVar57[0xb];
      auVar59[7] = 0;
      auVar59[8] = auVar57[0xc];
      auVar59[9] = 0;
      auVar59[10] = auVar57[0xd];
      auVar59[0xb] = 0;
      auVar59[0xc] = auVar57[0xe];
      auVar59[0xd] = 0;
      auVar59[0xe] = auVar57[0xf];
      auVar59[0xf] = 0;
      auVar59 = pshuflw(auVar59,auVar59,0xc6);
      auVar59 = pshufhw(auVar59,auVar59,0xc6);
      auVar35[0xd] = 0;
      auVar35._0_13_ = auVar57._0_13_;
      auVar35[0xe] = auVar57[7];
      auVar37[0xc] = auVar57[6];
      auVar37._0_12_ = auVar57._0_12_;
      auVar37._13_2_ = auVar35._13_2_;
      auVar39[0xb] = 0;
      auVar39._0_11_ = auVar57._0_11_;
      auVar39._12_3_ = auVar37._12_3_;
      auVar41[10] = auVar57[5];
      auVar41._0_10_ = auVar57._0_10_;
      auVar41._11_4_ = auVar39._11_4_;
      auVar43[9] = 0;
      auVar43._0_9_ = auVar57._0_9_;
      auVar43._10_5_ = auVar41._10_5_;
      auVar45[8] = auVar57[4];
      auVar45._0_8_ = auVar57._0_8_;
      auVar45._9_6_ = auVar43._9_6_;
      auVar49._7_8_ = 0;
      auVar49._0_7_ = auVar45._8_7_;
      auVar51._1_8_ = SUB158(auVar49 << 0x40,7);
      auVar51[0] = auVar57[3];
      auVar51._9_6_ = 0;
      auVar52._1_10_ = SUB1510(auVar51 << 0x30,5);
      auVar52[0] = auVar57[2];
      auVar52._11_4_ = 0;
      auVar47[2] = auVar57[1];
      auVar47._0_2_ = auVar57._0_2_;
      auVar47._3_12_ = SUB1512(auVar52 << 0x20,3);
      auVar57._0_2_ = auVar57._0_2_ & 0xff;
      auVar57._2_13_ = auVar47._2_13_;
      auVar57[0xf] = 0;
      auVar57 = pshuflw(auVar57,auVar57,0xc6);
      auVar57 = pshufhw(auVar57,auVar57,0xc6);
      sVar3 = auVar57._0_2_;
      sVar5 = auVar57._2_2_;
      sVar7 = auVar57._4_2_;
      sVar9 = auVar57._6_2_;
      sVar11 = auVar57._8_2_;
      sVar13 = auVar57._10_2_;
      sVar15 = auVar57._12_2_;
      sVar17 = auVar57._14_2_;
      sVar19 = auVar59._0_2_;
      sVar21 = auVar59._2_2_;
      sVar23 = auVar59._4_2_;
      sVar25 = auVar59._6_2_;
      sVar27 = auVar59._8_2_;
      sVar29 = auVar59._10_2_;
      sVar31 = auVar59._12_2_;
      sVar33 = auVar59._14_2_;
      auVar60[1] = 0;
      auVar60[0] = auVar58[8];
      auVar60[2] = auVar58[9];
      auVar60[3] = 0;
      auVar60[4] = auVar58[10];
      auVar60[5] = 0;
      auVar60[6] = auVar58[0xb];
      auVar60[7] = 0;
      auVar60[8] = auVar58[0xc];
      auVar60[9] = 0;
      auVar60[10] = auVar58[0xd];
      auVar60[0xb] = 0;
      auVar60[0xc] = auVar58[0xe];
      auVar60[0xd] = 0;
      auVar60[0xe] = auVar58[0xf];
      auVar60[0xf] = 0;
      auVar60 = pshuflw(auVar60,auVar60,0xc6);
      auVar60 = pshufhw(auVar60,auVar60,0xc6);
      auVar36[0xd] = 0;
      auVar36._0_13_ = auVar58._0_13_;
      auVar36[0xe] = auVar58[7];
      auVar38[0xc] = auVar58[6];
      auVar38._0_12_ = auVar58._0_12_;
      auVar38._13_2_ = auVar36._13_2_;
      auVar40[0xb] = 0;
      auVar40._0_11_ = auVar58._0_11_;
      auVar40._12_3_ = auVar38._12_3_;
      auVar42[10] = auVar58[5];
      auVar42._0_10_ = auVar58._0_10_;
      auVar42._11_4_ = auVar40._11_4_;
      auVar44[9] = 0;
      auVar44._0_9_ = auVar58._0_9_;
      auVar44._10_5_ = auVar42._10_5_;
      auVar46[8] = auVar58[4];
      auVar46._0_8_ = auVar58._0_8_;
      auVar46._9_6_ = auVar44._9_6_;
      auVar50._7_8_ = 0;
      auVar50._0_7_ = auVar46._8_7_;
      auVar53._1_8_ = SUB158(auVar50 << 0x40,7);
      auVar53[0] = auVar58[3];
      auVar53._9_6_ = 0;
      auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
      auVar54[0] = auVar58[2];
      auVar54._11_4_ = 0;
      auVar48[2] = auVar58[1];
      auVar48._0_2_ = auVar58._0_2_;
      auVar48._3_12_ = SUB1512(auVar54 << 0x20,3);
      auVar58._0_2_ = auVar58._0_2_ & 0xff;
      auVar58._2_13_ = auVar48._2_13_;
      auVar58[0xf] = 0;
      auVar58 = pshuflw(auVar58,auVar58,0xc6);
      auVar58 = pshufhw(auVar58,auVar58,0xc6);
      sVar4 = auVar58._0_2_;
      sVar6 = auVar58._2_2_;
      sVar8 = auVar58._4_2_;
      sVar10 = auVar58._6_2_;
      sVar12 = auVar58._8_2_;
      sVar14 = auVar58._10_2_;
      sVar16 = auVar58._12_2_;
      sVar18 = auVar58._14_2_;
      sVar20 = auVar60._0_2_;
      sVar22 = auVar60._2_2_;
      sVar24 = auVar60._4_2_;
      sVar26 = auVar60._6_2_;
      sVar28 = auVar60._8_2_;
      sVar30 = auVar60._10_2_;
      sVar32 = auVar60._12_2_;
      sVar34 = auVar60._14_2_;
      *dst = (0 < sVar3) * (sVar3 < 0x100) * auVar57[0] - (0xff < sVar3);
      dst[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar57[2] - (0xff < sVar5);
      dst[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar57[4] - (0xff < sVar7);
      dst[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar57[6] - (0xff < sVar9);
      dst[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar57[8] - (0xff < sVar11);
      dst[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar57[10] - (0xff < sVar13);
      dst[6] = (0 < sVar15) * (sVar15 < 0x100) * auVar57[0xc] - (0xff < sVar15);
      dst[7] = (0 < sVar17) * (sVar17 < 0x100) * auVar57[0xe] - (0xff < sVar17);
      dst[8] = (0 < sVar19) * (sVar19 < 0x100) * auVar59[0] - (0xff < sVar19);
      dst[9] = (0 < sVar21) * (sVar21 < 0x100) * auVar59[2] - (0xff < sVar21);
      dst[10] = (0 < sVar23) * (sVar23 < 0x100) * auVar59[4] - (0xff < sVar23);
      dst[0xb] = (0 < sVar25) * (sVar25 < 0x100) * auVar59[6] - (0xff < sVar25);
      dst[0xc] = (0 < sVar27) * (sVar27 < 0x100) * auVar59[8] - (0xff < sVar27);
      dst[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar59[10] - (0xff < sVar29);
      dst[0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar59[0xc] - (0xff < sVar31);
      dst[0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar59[0xe] - (0xff < sVar33);
      dst[0x10] = (0 < sVar4) * (sVar4 < 0x100) * auVar58[0] - (0xff < sVar4);
      dst[0x11] = (0 < sVar6) * (sVar6 < 0x100) * auVar58[2] - (0xff < sVar6);
      dst[0x12] = (0 < sVar8) * (sVar8 < 0x100) * auVar58[4] - (0xff < sVar8);
      dst[0x13] = (0 < sVar10) * (sVar10 < 0x100) * auVar58[6] - (0xff < sVar10);
      dst[0x14] = (0 < sVar12) * (sVar12 < 0x100) * auVar58[8] - (0xff < sVar12);
      dst[0x15] = (0 < sVar14) * (sVar14 < 0x100) * auVar58[10] - (0xff < sVar14);
      dst[0x16] = (0 < sVar16) * (sVar16 < 0x100) * auVar58[0xc] - (0xff < sVar16);
      dst[0x17] = (0 < sVar18) * (sVar18 < 0x100) * auVar58[0xe] - (0xff < sVar18);
      dst[0x18] = (0 < sVar20) * (sVar20 < 0x100) * auVar60[0] - (0xff < sVar20);
      dst[0x19] = (0 < sVar22) * (sVar22 < 0x100) * auVar60[2] - (0xff < sVar22);
      dst[0x1a] = (0 < sVar24) * (sVar24 < 0x100) * auVar60[4] - (0xff < sVar24);
      dst[0x1b] = (0 < sVar26) * (sVar26 < 0x100) * auVar60[6] - (0xff < sVar26);
      dst[0x1c] = (0 < sVar28) * (sVar28 < 0x100) * auVar60[8] - (0xff < sVar28);
      dst[0x1d] = (0 < sVar30) * (sVar30 < 0x100) * auVar60[10] - (0xff < sVar30);
      dst[0x1e] = (0 < sVar32) * (sVar32 < 0x100) * auVar60[0xc] - (0xff < sVar32);
      dst[0x1f] = (0 < sVar34) * (sVar34 < 0x100) * auVar60[0xe] - (0xff < sVar34);
      dst = dst + 0x20;
      num_pixels = iVar56 + -8;
      bVar2 = 0xf < iVar56;
      iVar56 = num_pixels;
    } while (bVar2);
  }
  if (0 < num_pixels) {
    if (0 < num_pixels) {
      puVar55 = *(undefined1 (*) [16])src;
      do {
        uVar1 = *(undefined4 *)*(undefined1 (*) [16])src;
        src = (uint32_t *)(*(undefined1 (*) [16])src + 4);
        *dst = (uint8_t)((uint)uVar1 >> 0x10);
        dst[1] = (uint8_t)((uint)uVar1 >> 8);
        dst[2] = (uint8_t)uVar1;
        dst[3] = (uint8_t)((uint)uVar1 >> 0x18);
        dst = dst + 4;
      } while (src < (undefined1 (*) [16])(puVar55 + (long)num_pixels * 4));
    }
    return;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA_SSE2(const uint32_t* WEBP_RESTRICT src,
                                   int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const __m128i red_blue_mask = _mm_set1_epi32(0x00ff00ff);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i A1 = _mm_loadu_si128(in++);
    const __m128i A2 = _mm_loadu_si128(in++);
    const __m128i B1 = _mm_and_si128(A1, red_blue_mask);     // R 0 B 0
    const __m128i B2 = _mm_and_si128(A2, red_blue_mask);     // R 0 B 0
    const __m128i C1 = _mm_andnot_si128(red_blue_mask, A1);  // 0 G 0 A
    const __m128i C2 = _mm_andnot_si128(red_blue_mask, A2);  // 0 G 0 A
    const __m128i D1 = _mm_shufflelo_epi16(B1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i D2 = _mm_shufflelo_epi16(B2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E1 = _mm_shufflehi_epi16(D1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E2 = _mm_shufflehi_epi16(D2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i F1 = _mm_or_si128(E1, C1);
    const __m128i F2 = _mm_or_si128(E2, C2);
    _mm_storeu_si128(out++, F1);
    _mm_storeu_si128(out++, F2);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}